

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O3

void check_stable(char *name,_func_void_int_ptr_ptr_size_t *sort_fun,int size,int num_values)

{
  int iVar1;
  int **array;
  char *pcVar2;
  size_t size_00;
  size_t sVar3;
  
  size_00 = (size_t)size;
  array = (int **)malloc(size_00 * 8);
  make_intp_array(array,size_00,num_values);
  (*sort_fun)(array,size_00);
  iVar1 = verify_stable(array,size_00,num_values);
  pcVar2 = "stable";
  if (iVar1 == 0) {
    pcVar2 = "UNSTABLE";
  }
  printf("%21s -- %s\n",name,pcVar2);
  if (0 < size) {
    sVar3 = 0;
    do {
      free(array[sVar3]);
      sVar3 = sVar3 + 1;
    } while (size_00 != sVar3);
  }
  free(array);
  return;
}

Assistant:

void check_stable(char *name, void (*sort_fun)(int **arr, size_t size),
                  int size, int num_values) {
  int **array = malloc(sizeof(int *) * size);
  make_intp_array(array, size, num_values);
  sort_fun(array, size);
  printf("%21s -- %s\n", name,
         verify_stable(array, size, num_values) ? "stable" : "UNSTABLE");
  clean_intp_array(array, size);
  free(array);
}